

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

param_configuration *
nonius::detail::parser<nonius::param_configuration>::parse
          (param_configuration *__return_storage_ptr__,string *param)

{
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this;
  __shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  mapped_type def;
  param step;
  param init;
  size_t count;
  value_type name;
  value_type oper;
  is_any_ofF local_228;
  undefined1 local_208 [64];
  __shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2> local_1c8;
  __shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  size_t local_1a8;
  stringstream ss;
  undefined1 local_170 [344];
  
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  is_any_of(&local_228,":");
  split<nonius::detail::is_any_ofF>(&local_2b8,param,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  if (local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
LAB_0016531f:
    *(undefined8 *)
     &(__return_storage_ptr__->map).
      super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
      ._M_h._M_rehash_policy = 0;
    (__return_storage_ptr__->map).
    super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
    ._M_h._M_buckets =
         &(__return_storage_ptr__->map).
          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
          ._M_h._M_single_bucket;
    (__return_storage_ptr__->map).
    super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
    ._M_h._M_bucket_count = 1;
    (__return_storage_ptr__->map).
    super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
    ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__return_storage_ptr__->map).
    super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
    ._M_h._M_element_count = 0;
    (__return_storage_ptr__->map).
    super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
    ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (__return_storage_ptr__->map).
    super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
    ._M_h._M_rehash_policy._M_next_resize = 0;
    (__return_storage_ptr__->map).
    super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
    ._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (__return_storage_ptr__->run).initialized = false;
  }
  else {
    std::__cxx11::string::string
              ((string *)&name,
               (string *)
               local_2b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    this = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            *)global_param_registry();
    p_Var1 = (__shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2> *)
             std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at(this,&name);
    std::__shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2> *)&def,p_Var1);
    lVar2 = (long)local_2b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_2b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (lVar2 == 5) {
      std::__cxx11::string::string
                ((string *)&oper,
                 (string *)
                 (local_2b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1));
      nonius::param::parse(&init,(string *)&def);
      nonius::param::parse(&step,(string *)&def);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&ss,
                 (string *)
                 (local_2b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4),_S_out|_S_in);
      std::istream::_M_extract<unsigned_long>((ulong *)&ss);
      std::ios::exceptions((int)&ss + (int)*(undefined8 *)(_ss + -0x18));
      *(undefined8 *)
       &(__return_storage_ptr__->map).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
        ._M_h._M_rehash_policy = 0;
      (__return_storage_ptr__->map).
      super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
      ._M_h._M_buckets =
           &(__return_storage_ptr__->map).
            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
            ._M_h._M_single_bucket;
      (__return_storage_ptr__->map).
      super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
      ._M_h._M_bucket_count = 1;
      (__return_storage_ptr__->map).
      super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
      ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (__return_storage_ptr__->map).
      super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
      ._M_h._M_element_count = 0;
      (__return_storage_ptr__->map).
      super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
      ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (__return_storage_ptr__->map).
      super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
      ._M_h._M_rehash_policy._M_next_resize = 0;
      (__return_storage_ptr__->map).
      super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
      ._M_h._M_single_bucket = (__node_base_ptr)0x0;
      std::__cxx11::string::string((string *)local_208,(string *)&name);
      std::__cxx11::string::string((string *)(local_208 + 0x20),(string *)&oper);
      std::__shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1c8,
                 (__shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2> *)&init);
      std::__shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1b8,
                 (__shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2> *)&step);
      local_1a8 = 0;
      optional<nonius::run_configuration>::optional
                (&__return_storage_ptr__->run,(run_configuration *)local_208);
      run_configuration::~run_configuration((run_configuration *)local_208);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&step.impl_.
                  super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&init.impl_.
                  super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)&oper);
    }
    else {
      if (lVar2 != 2) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&def.impl_.
                    super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)&name);
        goto LAB_0016531f;
      }
      nonius::param::parse((param *)local_208,(string *)&def);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_nonius::param,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>
                  *)&ss,&name,(param *)local_208);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nonius::param>,std::allocator<std::pair<std::__cxx11::string_const,nonius::param>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_Hashtable<std::pair<std::__cxx11::string_const,nonius::param>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nonius::param>,std::allocator<std::pair<std::__cxx11::string_const,nonius::param>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)__return_storage_ptr__,&ss,local_170,0,&oper,&init,&step);
      (__return_storage_ptr__->run).initialized = false;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>
               *)&ss);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_208 + 8));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&def.impl_.super___shared_ptr<nonius::param::interface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&name);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b8);
  return __return_storage_ptr__;
}

Assistant:

static param_configuration parse(std::string const& param) {
                auto v = std::vector<std::string>{};
                split(v, param, is_any_of(":"));
                try {
                    if (v.size() > 0) {
                        auto name = v[0];
                        auto def  = global_param_registry().defaults().at(name);
                        if (v.size() == 2)
                            return {{{name, def.parse(v[1])}}, {}};
                        else if (v.size() == 5) {
                            auto oper  = v[1];
                            auto init  = def.parse(v[2]);
                            auto step  = def.parse(v[3]);
                            std::stringstream ss(v[4]);
                            auto count = size_t();
                            ss >> count;
                            ss.exceptions(std::ios::failbit);
                            return {{}, run_configuration{name, oper, init, step, count}};
                        }
                    }
                }
                catch (std::out_of_range const&) {}
                return {};
            }